

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O1

void __thiscall Fl_Browser::insert(Fl_Browser *this,int line,char *newtext,void *d)

{
  size_t sVar1;
  FL_BLINE *item;
  char *__s;
  
  __s = "";
  if (newtext != (char *)0x0) {
    __s = newtext;
  }
  sVar1 = strlen(__s);
  item = (FL_BLINE *)malloc((long)(int)sVar1 + 0x28);
  item->length = (short)sVar1;
  item->flags = '\0';
  strcpy(item->txt,__s);
  item->data = d;
  item->icon = (Fl_Image *)0x0;
  insert(this,line,item);
  return;
}

Assistant:

void Fl_Browser::insert(int line, const char* newtext, void* d) {
  if (!newtext) newtext = "";		// STR #3269
  int l = (int) strlen(newtext);
  FL_BLINE* t = (FL_BLINE*)malloc(sizeof(FL_BLINE)+l);
  t->length = (short)l;
  t->flags = 0;
  strcpy(t->txt, newtext);
  t->data = d;
  t->icon = 0;
  insert(line, t);
}